

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_broadcast(Mat *a,Mat *b,Mat *c,int op_type,Option *opt)

{
  int *piVar1;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float *outptr_3;
  float *ptr1_3;
  float *ptr_3;
  int y1_1;
  int y0_1;
  int y_1;
  int z1_1;
  int z0_1;
  int z_1;
  float *outptr_2;
  float *ptr1_2;
  float *ptr_2;
  int z1;
  int z0;
  int z;
  float *outptr_1;
  float *ptr1_1;
  float *ptr_1;
  int q1;
  int q0;
  int q;
  int channels;
  float *outptr;
  float *ptr1;
  float *ptr;
  int y1;
  int y0;
  int y;
  int h;
  int dims;
  Mat *m_7;
  Mat *m_6;
  Mat *m_4;
  Mat *m_3;
  Mat *m_1;
  Mat *m;
  Mat *m_8;
  Mat *m_5;
  Mat *m_2;
  int in_stack_ffffffffffffee24;
  int in_stack_ffffffffffffee28;
  int in_stack_ffffffffffffee2c;
  float *in_stack_ffffffffffffee30;
  float *in_stack_ffffffffffffee38;
  float *in_stack_ffffffffffffee40;
  float *in_stack_ffffffffffffee50;
  undefined8 in_stack_ffffffffffffee58;
  Option *in_stack_ffffffffffffef30;
  undefined8 in_stack_ffffffffffffef38;
  Mat *in_stack_ffffffffffffef40;
  undefined8 in_stack_ffffffffffffef48;
  Mat *in_stack_ffffffffffffef50;
  Option *in_stack_ffffffffffffefa8;
  undefined8 in_stack_ffffffffffffefb0;
  Mat *in_stack_ffffffffffffefb8;
  Mat *in_stack_ffffffffffffefc0;
  Mat *in_stack_ffffffffffffefc8;
  float local_fd8 [8];
  long local_fb8;
  undefined4 local_fb0;
  undefined4 local_fac;
  undefined4 local_fa8;
  undefined4 local_fa4;
  undefined4 local_fa0;
  undefined8 local_f98;
  float local_f90 [8];
  long local_f70;
  undefined4 local_f68;
  undefined4 local_f64;
  undefined4 local_f60;
  undefined4 local_f5c;
  undefined4 local_f58;
  undefined8 local_f50;
  float *local_f48;
  undefined8 local_f40;
  undefined8 local_f38;
  undefined8 local_f30;
  undefined4 local_f28;
  long local_f20;
  undefined4 local_f18;
  undefined4 local_f14;
  undefined4 local_f10;
  undefined4 local_f0c;
  undefined4 local_f08;
  undefined8 local_f00;
  undefined8 local_ef8;
  undefined8 local_ef0;
  undefined8 local_ee8;
  undefined4 local_ee0;
  long local_ed8;
  undefined4 local_ed0;
  undefined4 local_ecc;
  undefined4 local_ec8;
  undefined4 local_ec4;
  undefined4 local_ec0;
  undefined8 local_eb8;
  long local_eb0;
  undefined8 local_ea8;
  undefined8 local_ea0;
  undefined8 local_e98;
  undefined4 local_e90;
  long local_e88;
  undefined4 local_e80;
  undefined4 local_e7c;
  undefined4 local_e78;
  undefined4 local_e74;
  undefined4 local_e70;
  undefined8 local_e68;
  undefined8 local_e60;
  undefined8 local_e58;
  undefined8 local_e50;
  undefined4 local_e48;
  long local_e40;
  undefined4 local_e38;
  undefined4 local_e34;
  undefined4 local_e30;
  undefined4 local_e2c;
  undefined4 local_e28;
  undefined8 local_e20;
  long local_e18;
  int local_e10;
  int local_e0c;
  int local_e08;
  int local_e04;
  int local_e00;
  int local_dfc;
  int local_df8;
  int local_df4;
  int local_df0;
  int local_dec;
  undefined8 local_de8;
  undefined8 local_de0;
  undefined8 local_dd8;
  undefined4 local_dd0;
  long local_dc8;
  undefined4 local_dc0;
  undefined4 local_dbc;
  undefined4 local_db8;
  undefined4 local_db4;
  undefined4 local_db0;
  undefined8 local_da8;
  undefined8 local_da0;
  undefined8 local_d98;
  undefined8 local_d90;
  undefined4 local_d88;
  long local_d80;
  undefined4 local_d78;
  undefined4 local_d74;
  undefined4 local_d70;
  undefined4 local_d6c;
  undefined4 local_d68;
  undefined8 local_d60;
  long local_d58;
  undefined8 local_d50;
  undefined8 local_d48;
  undefined8 local_d40;
  undefined4 local_d38;
  long local_d30;
  undefined4 local_d28;
  undefined4 local_d24;
  undefined4 local_d20;
  undefined4 local_d1c;
  undefined4 local_d18;
  undefined8 local_d10;
  undefined8 local_d08;
  undefined8 local_d00;
  undefined8 local_cf8;
  undefined4 local_cf0;
  long local_ce8;
  undefined4 local_ce0;
  undefined4 local_cdc;
  undefined4 local_cd8;
  undefined4 local_cd4;
  undefined4 local_cd0;
  undefined8 local_cc8;
  long local_cc0;
  undefined8 local_cb8;
  undefined8 local_cb0;
  undefined8 local_ca8;
  undefined4 local_ca0;
  long local_c98;
  undefined4 local_c90;
  undefined4 local_c8c;
  undefined4 local_c88;
  undefined4 local_c84;
  undefined4 local_c80;
  undefined8 local_c78;
  undefined8 local_c70;
  undefined8 local_c68;
  undefined8 local_c60;
  undefined4 local_c58;
  long local_c50;
  undefined4 local_c48;
  undefined4 local_c44;
  undefined4 local_c40;
  undefined4 local_c3c;
  undefined4 local_c38;
  undefined8 local_c30;
  long local_c28;
  int local_c1c;
  int local_c18;
  int local_c14;
  int local_c10;
  int local_c0c;
  undefined8 local_c08;
  undefined8 local_c00;
  undefined8 local_bf8;
  undefined4 local_bf0;
  long local_be8;
  undefined4 local_be0;
  undefined4 local_bdc;
  undefined4 local_bd8;
  undefined4 local_bd4;
  undefined4 local_bd0;
  undefined8 local_bc8;
  long local_bc0;
  undefined8 local_bb8;
  undefined8 local_bb0;
  undefined8 local_ba8;
  undefined4 local_ba0;
  long local_b98;
  undefined4 local_b90;
  undefined4 local_b8c;
  undefined4 local_b88;
  undefined4 local_b84;
  undefined4 local_b80;
  undefined8 local_b78;
  long local_b70;
  undefined8 local_b58;
  undefined8 local_b50;
  undefined8 local_b48;
  undefined4 local_b40;
  long local_b38;
  undefined4 local_b30;
  undefined4 local_b2c;
  undefined4 local_b28;
  undefined4 local_b24;
  undefined4 local_b20;
  undefined8 local_b18;
  long local_b10;
  int local_b08;
  int local_b04;
  int local_b00;
  int local_afc;
  int local_af8;
  int local_af4;
  long local_af0;
  long local_ae8;
  long local_ae0;
  int local_ad4;
  int local_ad0;
  int local_acc;
  int local_ac8;
  int local_ac4;
  int local_ac0;
  int local_abc;
  long *local_aa8;
  long *local_aa0;
  long *local_a98;
  undefined8 *local_a90;
  undefined8 *local_a80;
  undefined8 *local_a70;
  undefined8 *local_a60;
  undefined8 *local_a50;
  undefined8 *local_a40;
  undefined8 *local_a30;
  undefined8 *local_a20;
  undefined8 *local_a10;
  undefined8 *local_a00;
  undefined8 *local_9f0;
  undefined8 *local_9e0;
  undefined8 *local_9d0;
  float *local_9c0;
  float *local_9b0;
  float *local_988;
  float *local_968;
  undefined8 *local_948;
  undefined8 *local_928;
  undefined8 *local_908;
  undefined8 *local_8e8;
  undefined8 *local_8c8;
  undefined8 *local_8a8;
  undefined8 *local_888;
  undefined8 *local_868;
  undefined8 *local_848;
  undefined8 *local_828;
  undefined8 *local_808;
  undefined8 *local_7e8;
  undefined8 *local_7c8;
  undefined8 local_6d0;
  int local_6bc;
  undefined8 *local_6b8;
  int local_6ac;
  undefined8 *local_6a8;
  int local_69c;
  long *local_698;
  int local_68c;
  long *local_688;
  int local_67c;
  float *local_678;
  int local_66c;
  long *local_668;
  undefined1 local_65d;
  int local_65c;
  undefined8 *local_650;
  undefined1 local_625;
  int local_624;
  undefined8 *local_618;
  undefined1 local_5ed;
  int local_5ec;
  undefined8 *local_5e0;
  undefined1 local_5b5;
  int local_5b4;
  undefined8 *local_5a8;
  undefined1 local_57d;
  int local_57c;
  undefined8 *local_570;
  undefined1 local_545;
  int local_544;
  undefined8 *local_538;
  undefined8 *local_510;
  undefined8 *local_508;
  undefined8 *local_500;
  undefined8 *local_4f8;
  undefined1 local_4ed;
  int local_4ec;
  float *local_4e0;
  undefined1 local_4b5;
  int local_4b4;
  undefined8 *local_4a8;
  undefined1 local_47d;
  int local_47c;
  undefined8 *local_470;
  undefined8 *local_448;
  undefined8 *local_440;
  int local_434;
  undefined8 *local_430;
  undefined8 *local_428;
  int local_41c;
  undefined8 *local_418;
  undefined8 *local_410;
  int local_404;
  undefined8 *local_400;
  undefined8 *local_3f8;
  int local_3ec;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  int local_3d4;
  float *local_3d0;
  float *local_3c8;
  int local_3bc;
  undefined8 *local_3b8;
  undefined8 *local_3b0;
  long local_3a8;
  undefined4 local_39c;
  long local_398;
  long local_390;
  undefined4 local_384;
  int local_380;
  int local_37c;
  undefined8 *local_378;
  long local_370;
  undefined4 local_364;
  long local_360;
  long local_358;
  undefined4 local_34c;
  int local_348;
  int local_344;
  undefined8 *local_340;
  long local_338;
  undefined4 local_32c;
  long local_328;
  long local_320;
  undefined4 local_314;
  int local_310;
  int local_30c;
  float *local_308;
  long local_300;
  undefined4 local_2f4;
  long local_2f0;
  long local_2e8;
  undefined4 local_2dc;
  int local_2d8;
  int local_2d4;
  undefined8 *local_2d0;
  long local_2c8;
  undefined4 local_2bc;
  long local_2b8;
  long local_2b0;
  undefined4 local_2a4;
  int local_2a0;
  int local_29c;
  undefined8 *local_298;
  long local_290;
  undefined4 local_284;
  long local_280;
  long local_278;
  undefined4 local_26c;
  int local_268;
  int local_264;
  undefined8 *local_260;
  long local_258;
  undefined4 local_24c;
  long local_248;
  long local_240;
  undefined4 local_234;
  int local_230;
  int local_22c;
  undefined8 *local_228;
  long local_220;
  undefined4 local_214;
  long local_210;
  long local_208;
  undefined4 local_1fc;
  int local_1f8;
  int local_1f4;
  undefined8 *local_1f0;
  long local_1e8;
  undefined4 local_1dc;
  long local_1d8;
  long local_1d0;
  undefined4 local_1c4;
  int local_1c0;
  int local_1bc;
  undefined8 *local_1b8;
  undefined4 local_1ac;
  long local_1a8;
  undefined4 local_19c;
  long local_198;
  undefined4 local_18c;
  long local_188;
  undefined4 local_17c;
  long local_178;
  undefined4 local_16c;
  long local_168;
  undefined4 local_15c;
  long local_158;
  undefined4 local_14c;
  long local_148;
  undefined4 local_13c;
  long local_138;
  undefined4 local_12c;
  long local_128;
  long local_120;
  undefined4 local_114;
  long local_110;
  long local_108;
  int local_100;
  int local_fc;
  undefined8 *local_f8;
  long local_f0;
  undefined4 local_e4;
  long local_e0;
  long local_d8;
  int local_d0;
  int local_cc;
  float *local_c8;
  long local_c0;
  undefined4 local_b4;
  long local_b0;
  long local_a8;
  int local_a0;
  int local_9c;
  undefined8 *local_98;
  long local_90;
  undefined4 local_84;
  long local_80;
  long local_78;
  int local_70;
  int local_6c;
  undefined8 *local_68;
  long local_60;
  undefined4 local_54;
  long local_50;
  long local_48;
  int local_40;
  int local_3c;
  undefined8 *local_38;
  long local_30;
  undefined4 local_24;
  long local_20;
  long local_18;
  int local_10;
  int local_c;
  undefined8 *local_8;
  
  if (*(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34) *
      (int)in_RSI[7] * (int)in_RSI[3] == 1) {
    local_6d0 = 0;
    binary_op_scalar(in_stack_ffffffffffffef50,(float)((ulong)in_stack_ffffffffffffef48 >> 0x20),
                     in_stack_ffffffffffffef40,(int)((ulong)in_stack_ffffffffffffef38 >> 0x20),
                     in_stack_ffffffffffffef30);
  }
  else if ((((((int)in_RDI[5] == (int)in_RSI[5]) &&
             (*(int *)((long)in_RDI + 0x2c) == *(int *)((long)in_RSI + 0x2c))) &&
            ((int)in_RDI[6] == (int)in_RSI[6])) &&
           ((*(int *)((long)in_RDI + 0x34) == *(int *)((long)in_RSI + 0x34) &&
            ((int)in_RDI[7] == (int)in_RSI[7])))) && ((int)in_RDI[3] == (int)in_RSI[3])) {
    binary_op_no_broadcast
              (in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8,
               (int)((ulong)in_stack_ffffffffffffefb0 >> 0x20),in_stack_ffffffffffffefa8);
  }
  else {
    local_abc = (int)in_RDX[5];
    local_aa8 = in_RDX;
    local_aa0 = in_RSI;
    local_a98 = in_RDI;
    if (local_abc == 2) {
      local_ac0 = (int)in_RDX[6];
      for (local_ac4 = 0; local_ac4 < local_ac0; local_ac4 = local_ac4 + 1) {
        local_acc = (int)local_a98[6] + -1;
        piVar1 = std::min<int>(&local_ac4,&local_acc);
        local_ac8 = *piVar1;
        local_ad4 = (int)local_aa0[6] + -1;
        piVar1 = std::min<int>(&local_ac4,&local_ad4);
        local_ad0 = *piVar1;
        local_688 = local_a98;
        local_68c = local_ac8;
        local_ae0 = *local_a98 +
                    (long)*(int *)((long)local_a98 + 0x2c) * (long)local_ac8 * local_a98[2];
        local_698 = local_aa0;
        local_ae8 = *local_aa0 +
                    (long)*(int *)((long)local_aa0 + 0x2c) * (long)local_ad0 * local_aa0[2];
        local_668 = local_aa8;
        local_66c = local_ac4;
        local_af0 = *local_aa8 +
                    (long)*(int *)((long)local_aa8 + 0x2c) * (long)local_ac4 * local_aa8[2];
        local_69c = local_ad0;
        binary_op_vector(in_stack_ffffffffffffee40,in_stack_ffffffffffffee38,
                         in_stack_ffffffffffffee30,in_stack_ffffffffffffee2c,
                         in_stack_ffffffffffffee28,in_stack_ffffffffffffee24,
                         (int)in_stack_ffffffffffffee50,(int)in_stack_ffffffffffffee58);
      }
    }
    if ((local_abc == 3) || (local_abc == 4)) {
      local_af4 = (int)local_aa8[7];
      for (local_af8 = 0; local_af8 < local_af4; local_af8 = local_af8 + 1) {
        local_b00 = (int)local_a98[7] + -1;
        piVar1 = std::min<int>(&local_af8,&local_b00);
        local_afc = *piVar1;
        local_b08 = (int)local_aa0[7] + -1;
        piVar1 = std::min<int>(&local_af8,&local_b08);
        local_b04 = *piVar1;
        if (*(int *)((long)local_aa0 + 0x34) * (int)local_aa0[6] * *(int *)((long)local_aa0 + 0x2c)
            == 1) {
          local_538 = &local_b58;
          local_2d4 = *(int *)((long)local_a98 + 0x2c);
          local_2d8 = (int)local_a98[6];
          local_2dc = *(undefined4 *)((long)local_a98 + 0x34);
          local_b10 = *local_a98 + local_a98[8] * (long)local_afc * local_a98[2];
          local_2f0 = local_a98[2];
          local_2f4 = (undefined4)local_a98[3];
          local_300 = local_a98[4];
          local_2d0 = &local_b58;
          local_158 = (long)local_2d4 * (long)local_2d8 * local_2f0;
          local_4f8 = &local_b58;
          local_a90 = &local_b58;
          local_570 = &local_bb8;
          local_29c = *(int *)((long)local_aa0 + 0x2c);
          local_2a0 = (int)local_aa0[6];
          local_2a4 = *(undefined4 *)((long)local_aa0 + 0x34);
          local_b70 = *local_aa0 + local_aa0[8] * (long)local_b04 * local_aa0[2];
          local_2b8 = local_aa0[2];
          local_2bc = (undefined4)local_aa0[3];
          local_2c8 = local_aa0[4];
          local_298 = &local_bb8;
          local_168 = (long)local_29c * (long)local_2a0 * local_2b8;
          local_500 = &local_bb8;
          local_a80 = &local_bb8;
          local_470 = &local_c08;
          local_37c = *(int *)((long)local_aa8 + 0x2c);
          local_380 = (int)local_aa8[6];
          local_384 = *(undefined4 *)((long)local_aa8 + 0x34);
          local_bc0 = *local_aa8 + local_aa8[8] * (long)local_af8 * local_aa8[2];
          local_398 = local_aa8[2];
          local_39c = (undefined4)local_aa8[3];
          local_3a8 = local_aa8[4];
          local_378 = &local_c08;
          local_128 = (long)local_37c * (long)local_380 * local_398;
          local_440 = &local_c08;
          local_a70 = &local_c08;
          local_b20 = 0;
          local_b24 = 0;
          local_b28 = 0;
          local_b2c = 0;
          local_b40 = 0;
          local_b48 = 0;
          local_b50 = 0;
          local_b58 = 0;
          local_b80 = 0;
          local_b84 = 0;
          local_b88 = 0;
          local_b8c = 0;
          local_ba0 = 0;
          local_ba8 = 0;
          local_bb0 = 0;
          local_bb8 = 0;
          local_12c = 0x10;
          local_15c = 0x10;
          local_16c = 0x10;
          local_47c = local_af8;
          local_47d = 1;
          local_544 = local_afc;
          local_545 = 1;
          local_57d = 1;
          local_b18 = 0;
          local_b30 = 0;
          local_b78 = 0;
          local_b90 = 0;
          local_c08 = 0;
          local_bf8 = 0;
          local_bf0 = 0;
          local_be0 = 0;
          local_bdc = 0;
          local_bd8 = 0;
          local_bd4 = 0;
          local_bd0 = 0;
          local_bc8 = 0;
          local_c00 = 0;
          local_808 = local_a70;
          local_7e8 = local_a80;
          local_7c8 = local_a90;
          local_57c = local_b04;
          local_390 = local_bc0;
          local_2e8 = local_b10;
          local_2b0 = local_b70;
          local_be8 = local_3a8;
          local_b98 = local_2c8;
          local_b38 = local_300;
          binary_op_vector(in_stack_ffffffffffffee40,in_stack_ffffffffffffee38,
                           in_stack_ffffffffffffee30,in_stack_ffffffffffffee2c,
                           in_stack_ffffffffffffee28,in_stack_ffffffffffffee24,
                           (int)in_stack_ffffffffffffee50,(int)in_stack_ffffffffffffee58);
        }
        else if ((int)local_aa0[6] * *(int *)((long)local_aa0 + 0x2c) == 1) {
          for (local_c0c = 0; local_c0c < *(int *)((long)local_aa8 + 0x34);
              local_c0c = local_c0c + 1) {
            local_c14 = *(int *)((long)local_a98 + 0x34) + -1;
            piVar1 = std::min<int>(&local_c0c,&local_c14);
            local_c10 = *piVar1;
            local_c1c = *(int *)((long)local_aa0 + 0x34) + -1;
            piVar1 = std::min<int>(&local_c0c,&local_c1c);
            local_c18 = *piVar1;
            local_5a8 = &local_cb8;
            local_264 = *(int *)((long)local_a98 + 0x2c);
            local_268 = (int)local_a98[6];
            local_26c = *(undefined4 *)((long)local_a98 + 0x34);
            local_278 = *local_a98 + local_a98[8] * (long)local_afc * local_a98[2];
            local_280 = local_a98[2];
            local_284 = (undefined4)local_a98[3];
            local_290 = local_a98[4];
            local_260 = &local_cb8;
            local_178 = (long)local_264 * (long)local_268 * local_280;
            local_3e0 = &local_c70;
            local_3e8 = &local_cb8;
            local_c28 = local_278 + (long)local_264 * (long)local_268 * (long)local_c10 * local_280;
            local_98 = &local_c70;
            local_508 = &local_c70;
            local_a60 = &local_c70;
            local_a50 = &local_cb8;
            local_5e0 = &local_d50;
            local_22c = *(int *)((long)local_aa0 + 0x2c);
            local_230 = (int)local_aa0[6];
            local_234 = *(undefined4 *)((long)local_aa0 + 0x34);
            local_240 = *local_aa0 + local_aa0[8] * (long)local_b04 * local_aa0[2];
            local_248 = local_aa0[2];
            local_24c = (undefined4)local_aa0[3];
            local_258 = local_aa0[4];
            local_228 = &local_d50;
            local_188 = (long)local_22c * (long)local_230 * local_248;
            local_3f8 = &local_d08;
            local_400 = &local_d50;
            local_cc0 = local_240 + (long)local_22c * (long)local_230 * (long)local_c18 * local_248;
            local_68 = &local_d08;
            local_510 = &local_d08;
            local_a40 = &local_d08;
            local_a30 = &local_d50;
            local_c30 = 0;
            local_c38 = 0;
            local_c3c = 0;
            local_c40 = 0;
            local_c44 = 0;
            local_c48 = 0;
            local_c58 = 0;
            local_c60 = 0;
            local_c68 = 0;
            local_c70 = 0;
            local_c80 = 0;
            local_c84 = 0;
            local_c88 = 0;
            local_c8c = 0;
            local_ca0 = 0;
            local_ca8 = 0;
            local_cb0 = 0;
            local_cb8 = 0;
            local_cc8 = 0;
            local_cd0 = 0;
            local_cd4 = 0;
            local_cd8 = 0;
            local_cdc = 0;
            local_ce0 = 0;
            local_cf0 = 0;
            local_cf8 = 0;
            local_d00 = 0;
            local_d08 = 0;
            local_17c = 0x10;
            local_18c = 0x10;
            local_3ec = local_c10;
            local_5b4 = local_afc;
            local_5b5 = 1;
            local_5ec = local_b04;
            local_5ed = 1;
            local_c78 = 0;
            local_c90 = 0;
            local_d50 = 0;
            local_d40 = 0;
            local_d38 = 0;
            local_d28 = 0;
            local_d24 = 0;
            local_d20 = 0;
            local_d1c = 0;
            local_d18 = 0;
            local_d10 = 0;
            local_d48 = 0;
            local_4a8 = &local_de8;
            local_344 = *(int *)((long)local_aa8 + 0x2c);
            local_348 = (int)local_aa8[6];
            local_34c = *(undefined4 *)((long)local_aa8 + 0x34);
            local_358 = *local_aa8 + local_aa8[8] * (long)local_af8 * local_aa8[2];
            local_360 = local_aa8[2];
            local_364 = (undefined4)local_aa8[3];
            local_370 = local_aa8[4];
            local_340 = &local_de8;
            local_138 = (long)local_344 * (long)local_348 * local_360;
            local_3b0 = &local_da0;
            local_3b8 = &local_de8;
            local_d58 = local_358 + (long)local_344 * (long)local_348 * (long)local_c0c * local_360;
            local_f8 = &local_da0;
            local_448 = &local_da0;
            local_a20 = &local_da0;
            local_a10 = &local_de8;
            local_d60 = 0;
            local_d68 = 0;
            local_d6c = 0;
            local_d70 = 0;
            local_d74 = 0;
            local_d78 = 0;
            local_d88 = 0;
            local_d90 = 0;
            local_d98 = 0;
            local_da0 = 0;
            local_13c = 0x10;
            local_3bc = local_c0c;
            local_4b4 = local_af8;
            local_4b5 = 1;
            local_de8 = 0;
            local_dd8 = 0;
            local_dd0 = 0;
            local_dc0 = 0;
            local_dbc = 0;
            local_db8 = 0;
            local_db4 = 0;
            local_db0 = 0;
            local_da8 = 0;
            local_de0 = 0;
            local_8c8 = local_a10;
            local_8a8 = local_a20;
            local_888 = local_a30;
            local_868 = local_a40;
            local_848 = local_a50;
            local_828 = local_a60;
            local_404 = local_c18;
            local_120 = local_370;
            local_114 = local_364;
            local_110 = local_360;
            local_108 = local_d58;
            local_100 = local_348;
            local_fc = local_344;
            local_c0 = local_290;
            local_b4 = local_284;
            local_b0 = local_280;
            local_a8 = local_c28;
            local_a0 = local_268;
            local_9c = local_264;
            local_90 = local_258;
            local_84 = local_24c;
            local_80 = local_248;
            local_78 = local_cc0;
            local_70 = local_230;
            local_6c = local_22c;
            local_dc8 = local_370;
            local_d80 = local_370;
            local_d30 = local_258;
            local_ce8 = local_258;
            local_c98 = local_290;
            local_c50 = local_290;
            binary_op_vector(in_stack_ffffffffffffee40,in_stack_ffffffffffffee38,
                             in_stack_ffffffffffffee30,in_stack_ffffffffffffee2c,
                             in_stack_ffffffffffffee28,in_stack_ffffffffffffee24,
                             (int)in_stack_ffffffffffffee50,(int)in_stack_ffffffffffffee58);
          }
        }
        else {
          for (local_dec = 0; local_dec < *(int *)((long)local_aa8 + 0x34);
              local_dec = local_dec + 1) {
            local_df4 = *(int *)((long)local_a98 + 0x34) + -1;
            piVar1 = std::min<int>(&local_dec,&local_df4);
            local_df0 = *piVar1;
            local_dfc = *(int *)((long)local_aa0 + 0x34) + -1;
            piVar1 = std::min<int>(&local_dec,&local_dfc);
            local_df8 = *piVar1;
            for (local_e00 = 0; local_e00 < (int)local_aa8[6]; local_e00 = local_e00 + 1) {
              local_e08 = (int)local_a98[6] + -1;
              piVar1 = std::min<int>(&local_e00,&local_e08);
              local_e04 = *piVar1;
              local_e10 = (int)local_aa0[6] + -1;
              piVar1 = std::min<int>(&local_e00,&local_e10);
              local_e0c = *piVar1;
              local_618 = &local_ea8;
              local_1f4 = *(int *)((long)local_a98 + 0x2c);
              local_1f8 = (int)local_a98[6];
              local_1fc = *(undefined4 *)((long)local_a98 + 0x34);
              local_208 = *local_a98 + local_a98[8] * (long)local_afc * local_a98[2];
              local_210 = local_a98[2];
              local_214 = (undefined4)local_a98[3];
              local_220 = local_a98[4];
              local_1f0 = &local_ea8;
              local_198 = (long)local_1f4 * (long)local_1f8 * local_210;
              local_410 = &local_e60;
              local_418 = &local_ea8;
              local_48 = local_208 + (long)local_1f4 * (long)local_1f8 * (long)local_df0 * local_210
              ;
              local_38 = &local_e60;
              local_6a8 = &local_e60;
              local_e18 = local_48 + (long)local_1f4 * (long)local_e04 * local_210;
              local_a00 = &local_e60;
              local_9f0 = &local_ea8;
              local_650 = &local_f40;
              local_1bc = *(int *)((long)local_aa0 + 0x2c);
              local_1c0 = (int)local_aa0[6];
              local_1c4 = *(undefined4 *)((long)local_aa0 + 0x34);
              local_1d0 = *local_aa0 + local_aa0[8] * (long)local_b04 * local_aa0[2];
              local_1d8 = local_aa0[2];
              local_1dc = (undefined4)local_aa0[3];
              local_1e8 = local_aa0[4];
              local_1b8 = &local_f40;
              local_1a8 = (long)local_1bc * (long)local_1c0 * local_1d8;
              local_428 = &local_ef8;
              local_430 = &local_f40;
              local_18 = local_1d0 + (long)local_1bc * (long)local_1c0 * (long)local_df8 * local_1d8
              ;
              local_8 = &local_ef8;
              local_6b8 = &local_ef8;
              local_eb0 = local_18 + (long)local_1bc * (long)local_e0c * local_1d8;
              local_9e0 = &local_ef8;
              local_9d0 = &local_f40;
              local_4e0 = local_fd8;
              local_30c = *(int *)((long)local_aa8 + 0x2c);
              local_310 = (int)local_aa8[6];
              local_314 = *(undefined4 *)((long)local_aa8 + 0x34);
              local_320 = *local_aa8 + local_aa8[8] * (long)local_af8 * local_aa8[2];
              local_328 = local_aa8[2];
              local_32c = (undefined4)local_aa8[3];
              local_338 = local_aa8[4];
              local_308 = local_fd8;
              local_148 = (long)local_30c * (long)local_310 * local_328;
              local_3c8 = local_f90;
              local_3d0 = local_fd8;
              local_d8 = local_320 + (long)local_30c * (long)local_310 * (long)local_dec * local_328
              ;
              in_stack_ffffffffffffee50 = local_f90;
              local_678 = local_f90;
              in_stack_ffffffffffffee40 =
                   (float *)(local_d8 + (long)local_30c * (long)local_e00 * local_328);
              in_stack_ffffffffffffee38 = local_f90;
              in_stack_ffffffffffffee30 = local_fd8;
              local_e20 = 0;
              local_e28 = 0;
              local_e2c = 0;
              local_e30 = 0;
              local_e34 = 0;
              local_e38 = 0;
              local_e48 = 0;
              local_e50 = 0;
              local_e58 = 0;
              local_e60 = 0;
              local_e70 = 0;
              local_e74 = 0;
              local_e78 = 0;
              local_e7c = 0;
              local_e90 = 0;
              local_e98 = 0;
              local_ea0 = 0;
              local_ea8 = 0;
              local_eb8 = 0;
              local_ec0 = 0;
              local_ec4 = 0;
              local_ec8 = 0;
              local_ecc = 0;
              local_ed0 = 0;
              local_ee0 = 0;
              local_ee8 = 0;
              local_ef0 = 0;
              local_ef8 = 0;
              local_f08 = 0;
              local_f0c = 0;
              local_f10 = 0;
              local_f14 = 0;
              local_f28 = 0;
              local_f30 = 0;
              local_f38 = 0;
              local_f40 = 0;
              local_f50 = 0;
              local_f58 = 0;
              local_f5c = 0;
              local_f60 = 0;
              local_f64 = 0;
              local_f68 = 0;
              local_f90[6] = 0.0;
              local_f90[4] = 0.0;
              local_f90[5] = 0.0;
              local_f90[2] = 0.0;
              local_f90[3] = 0.0;
              local_f90[0] = 0.0;
              local_f90[1] = 0.0;
              local_14c = 0x10;
              local_19c = 0x10;
              local_1ac = 0x10;
              local_3d4 = local_dec;
              local_41c = local_df0;
              local_434 = local_df8;
              local_4ec = local_af8;
              local_4ed = 1;
              local_624 = local_afc;
              local_625 = 1;
              local_65c = local_b04;
              local_65d = 1;
              local_67c = local_e00;
              local_6ac = local_e04;
              local_e68 = 0;
              local_e80 = 0;
              local_f00 = 0;
              local_f18 = 0;
              local_fd8[0] = 0.0;
              local_fd8[1] = 0.0;
              local_fd8[4] = 0.0;
              local_fd8[5] = 0.0;
              local_fd8[6] = 0.0;
              local_fb0 = 0;
              local_fac = 0;
              local_fa8 = 0;
              local_fa4 = 0;
              local_fa0 = 0;
              local_f98 = 0;
              local_fd8[2] = 0.0;
              local_fd8[3] = 0.0;
              local_f48 = in_stack_ffffffffffffee40;
              local_9c0 = in_stack_ffffffffffffee38;
              local_9b0 = in_stack_ffffffffffffee30;
              local_988 = in_stack_ffffffffffffee30;
              local_968 = in_stack_ffffffffffffee38;
              local_948 = local_9d0;
              local_928 = local_9e0;
              local_908 = local_9f0;
              local_8e8 = local_a00;
              local_6bc = local_e0c;
              local_f0 = local_338;
              local_e4 = local_32c;
              local_e0 = local_328;
              local_d0 = local_310;
              local_cc = local_30c;
              local_c8 = in_stack_ffffffffffffee50;
              local_60 = local_220;
              local_54 = local_214;
              local_50 = local_210;
              local_40 = local_1f8;
              local_3c = local_1f4;
              local_30 = local_1e8;
              local_24 = local_1dc;
              local_20 = local_1d8;
              local_10 = local_1c0;
              local_c = local_1bc;
              local_fb8 = local_338;
              local_f70 = local_338;
              local_f20 = local_1e8;
              local_ed8 = local_1e8;
              local_e88 = local_220;
              local_e40 = local_220;
              binary_op_vector(in_stack_ffffffffffffee40,in_stack_ffffffffffffee38,
                               in_stack_ffffffffffffee30,in_stack_ffffffffffffee2c,
                               in_stack_ffffffffffffee28,in_stack_ffffffffffffee24,
                               (int)in_stack_ffffffffffffee50,(int)in_stack_ffffffffffffee58);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void binary_op_broadcast(const Mat& a, const Mat& b, Mat& c, int op_type, const Option& opt)
{
    if (b.w * b.h * b.d * b.c * b.elempack == 1)
    {
        return binary_op_scalar(a, b[0], c, op_type, opt);
    }

    if (a.dims == b.dims && a.w == b.w && a.h == b.h && a.d == b.d && a.c == b.c && a.elempack == b.elempack)
    {
        return binary_op_no_broadcast(a, b, c, op_type, opt);
    }

    const int dims = c.dims;

    if (dims == 2)
    {
        const int h = c.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const int y0 = std::min(y, a.h - 1);
            const int y1 = std::min(y, b.h - 1);

            const float* ptr = a.row(y0);
            const float* ptr1 = b.row(y1);
            float* outptr = c.row(y);

            binary_op_vector(ptr, ptr1, outptr, a.w, b.w, a.elempack, b.elempack, op_type);
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int channels = c.c;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const int q0 = std::min(q, a.c - 1);
            const int q1 = std::min(q, b.c - 1);

            if (b.d * b.h * b.w == 1)
            {
                const float* ptr = a.channel(q0);
                const float* ptr1 = b.channel(q1);
                float* outptr = c.channel(q);

                binary_op_vector(ptr, ptr1, outptr, a.w * a.h * a.d, 1, a.elempack, b.elempack, op_type);
                continue;
            }

            if (b.h * b.w == 1)
            {
                for (int z = 0; z < c.d; z++)
                {
                    const int z0 = std::min(z, a.d - 1);
                    const int z1 = std::min(z, b.d - 1);

                    const float* ptr = a.channel(q0).depth(z0);
                    const float* ptr1 = b.channel(q1).depth(z1);
                    float* outptr = c.channel(q).depth(z);

                    binary_op_vector(ptr, ptr1, outptr, a.w * a.h, 1, a.elempack, b.elempack, op_type);
                }
                continue;
            }

            for (int z = 0; z < c.d; z++)
            {
                const int z0 = std::min(z, a.d - 1);
                const int z1 = std::min(z, b.d - 1);

                for (int y = 0; y < c.h; y++)
                {
                    const int y0 = std::min(y, a.h - 1);
                    const int y1 = std::min(y, b.h - 1);

                    const float* ptr = a.channel(q0).depth(z0).row(y0);
                    const float* ptr1 = b.channel(q1).depth(z1).row(y1);
                    float* outptr = c.channel(q).depth(z).row(y);

                    binary_op_vector(ptr, ptr1, outptr, a.w, b.w, a.elempack, b.elempack, op_type);
                }
            }
        }
    }
}